

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

int __thiscall
kj::anon_unknown_35::InMemoryFile::truncate(InMemoryFile *this,char *__file,__off_t __length)

{
  Impl *this_00;
  char *pcVar1;
  int extraout_EAX;
  long lVar2;
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> lock;
  
  _::Mutex::lock(&(this->impl).mutex,EXCLUSIVE);
  this_00 = &(this->impl).value;
  pcVar1 = (char *)(this->impl).value.size;
  if (__file < pcVar1) {
    lVar2 = (*(code *)**(undefined8 **)this_00->clock)();
    (this->impl).value.lastModified.value.value = lVar2;
    memset(__file + (long)(this->impl).value.bytes.ptr,0,(this->impl).value.size - (long)__file);
  }
  else {
    if (__file <= pcVar1) goto LAB_0021ad19;
    lVar2 = (*(code *)**(undefined8 **)this_00->clock)();
    (this->impl).value.lastModified.value.value = lVar2;
    Impl::ensureCapacity(this_00,(size_t)__file);
  }
  (this->impl).value.size = (size_t)__file;
LAB_0021ad19:
  _::Mutex::unlock(&(this->impl).mutex,EXCLUSIVE);
  return extraout_EAX;
}

Assistant:

void truncate(uint64_t newSize) const override {
    auto lock = impl.lockExclusive();
    if (newSize < lock->size) {
      lock->modified();
      memset(lock->bytes.begin() + newSize, 0, lock->size - newSize);
      lock->size = newSize;
    } else if (newSize > lock->size) {
      lock->modified();
      lock->ensureCapacity(newSize);
      lock->size = newSize;
    }
  }